

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O2

LogLevel pbrt::LogLevelFromString(string *s)

{
  bool bVar1;
  LogLevel LVar2;
  
  bVar1 = std::operator==(s,"verbose");
  LVar2 = Verbose;
  if (!bVar1) {
    bVar1 = std::operator==(s,"error");
    if (bVar1) {
      LVar2 = Error;
    }
    else {
      bVar1 = std::operator==(s,"fatal");
      LVar2 = bVar1 ^ Invalid;
    }
  }
  return LVar2;
}

Assistant:

LogLevel LogLevelFromString(const std::string &s) {
    if (s == "verbose")
        return LogLevel::Verbose;
    else if (s == "error")
        return LogLevel::Error;
    else if (s == "fatal")
        return LogLevel::Fatal;
    return LogLevel::Invalid;
}